

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O0

int mbedtls_chachapoly_self_test(int verbose)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uchar local_1e8 [8];
  uchar mac [16];
  uchar output [200];
  int ret;
  uint i;
  mbedtls_chachapoly_context ctx;
  int verbose_local;
  
  bVar1 = false;
  ctx.state = verbose;
  while( true ) {
    if (bVar1) {
      if (ctx.state != 0) {
        printf(anon_var_dwarf_17d4d + 8);
      }
      return 0;
    }
    if (ctx.state != 0) {
      printf("  ChaCha20-Poly1305 test %u ",0);
    }
    mbedtls_chachapoly_init((mbedtls_chachapoly_context *)&ret);
    uVar2 = mbedtls_chachapoly_setkey((mbedtls_chachapoly_context *)&ret,test_key[0]);
    if (uVar2 != 0) {
      if (ctx.state != 0) {
        printf("setkey() error code: %i\n",(ulong)uVar2);
      }
      return -1;
    }
    uVar2 = mbedtls_chachapoly_encrypt_and_tag
                      ((mbedtls_chachapoly_context *)&ret,0x72,test_nonce[0],test_aad[0],0xc,
                       test_input[0],mac + 8,local_1e8);
    if (uVar2 != 0) {
      if (ctx.state != 0) {
        printf("crypt_and_tag() error code: %i\n",(ulong)uVar2);
      }
      return -1;
    }
    iVar3 = memcmp(mac + 8,test_output,0x72);
    if (iVar3 != 0) break;
    iVar3 = memcmp(local_1e8,test_mac,0x10);
    if (iVar3 != 0) {
      if (ctx.state != 0) {
        printf("failure (wrong MAC)\n");
      }
      return -1;
    }
    mbedtls_chachapoly_free((mbedtls_chachapoly_context *)&ret);
    if (ctx.state != 0) {
      printf("passed\n");
    }
    bVar1 = true;
  }
  if (ctx.state != 0) {
    printf("failure (wrong output)\n");
  }
  return -1;
}

Assistant:

int mbedtls_chachapoly_self_test( int verbose )
{
    mbedtls_chachapoly_context ctx;
    unsigned i;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char output[200];
    unsigned char mac[16];

    for( i = 0U; i < 1U; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  ChaCha20-Poly1305 test %u ", i );

        mbedtls_chachapoly_init( &ctx );

        ret = mbedtls_chachapoly_setkey( &ctx, test_key[i] );
        ASSERT( 0 == ret, ( "setkey() error code: %i\n", ret ) );

        ret = mbedtls_chachapoly_encrypt_and_tag( &ctx,
                                                  test_input_len[i],
                                                  test_nonce[i],
                                                  test_aad[i],
                                                  test_aad_len[i],
                                                  test_input[i],
                                                  output,
                                                  mac );

        ASSERT( 0 == ret, ( "crypt_and_tag() error code: %i\n", ret ) );

        ASSERT( 0 == memcmp( output, test_output[i], test_input_len[i] ),
                ( "failure (wrong output)\n" ) );

        ASSERT( 0 == memcmp( mac, test_mac[i], 16U ),
                ( "failure (wrong MAC)\n" ) );

        mbedtls_chachapoly_free( &ctx );

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}